

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CharacterClassPass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  EncodedChar *location;
  code *pcVar1;
  codepoint_t cVar2;
  EncodedChar EVar3;
  bool bVar4;
  Char CVar5;
  undefined4 *puVar6;
  codepoint_t cVar7;
  codepoint_t codePointValue;
  codepoint_t codePointValue_00;
  char16 local_44;
  Char local_42;
  char16 local_40;
  char16 local_3e;
  char16 ignore;
  Char outChar;
  char16 leftSingleChar;
  char16 rightSingleChar;
  codepoint_t local_34;
  bool previousSurrogatePart;
  
  EVar3 = ECLookahead(this,0);
  if (EVar3 == '^') {
    ECConsume(this,1);
  }
  EVar3 = ECLookahead(this,0);
  rightSingleChar._1_1_ = '\0';
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  _ignore = 0xffffffff;
  cVar7 = 0xffffffff;
  local_34 = _ignore;
  do {
    if (EVar3 == ']') {
      if (_ignore != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x83a,"(pendingRangeEnd == INVALID_CODEPOINT)",
                           "pendingRangeEnd == INVALID_CODEPOINT");
        if (!bVar4) {
LAB_00d2e019:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      return;
    }
    if (EVar3 == '\\') {
      local_42 = NextChar(this);
      bVar4 = ClassEscapePass0(this,&local_42,(bool *)((long)&rightSingleChar + 1));
      cVar7 = (codepoint_t)(ushort)local_42;
      cVar2 = local_34;
      if (_ignore == 0xffffffff) {
        cVar2 = 0xffffffff;
      }
      codePointValue_00 = local_34;
      if (!bVar4) {
        cVar7 = 0xffffffff;
        codePointValue_00 = cVar2;
      }
    }
    else {
      location = this->next;
      if (EVar3 == '-') {
        if ((local_34 == 0xffffffff) && (cVar7 != 0xffffffff)) {
          if (location == this->positionAfterLastSurrogate) {
            cVar7 = this->valueOfLastSurrogate;
          }
          local_34 = cVar7;
          NextChar(this);
          cVar7 = 0xffffffff;
        }
        else {
          CVar5 = NextChar(this);
          cVar7 = (codepoint_t)(ushort)CVar5;
        }
        this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
        codePointValue_00 = local_34;
        if (rightSingleChar._1_1_ == '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x7d6,"(!previousSurrogatePart)","!previousSurrogatePart");
          if (!bVar4) goto LAB_00d2e019;
          *puVar6 = 0;
          codePointValue_00 = local_34;
        }
      }
      else {
        if ((EVar3 == '\0') && (this->inputLim <= location)) {
          Fail(this,-0x7ff5ec65);
          return;
        }
        CVar5 = NextChar(this);
        cVar7 = (codepoint_t)(ushort)CVar5;
        codePointValue_00 = local_34;
        if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
          TrackIfSurrogatePair
                    (this,(uint)(ushort)CVar5,location,*(int *)&this->next - (int)location);
          codePointValue_00 = local_34;
        }
      }
    }
    if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
      cVar2 = _ignore;
      if ((codePointValue_00 != 0xffffffff) && (cVar7 != 0xffffffff)) {
        if (0xffff < codePointValue_00) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x7e7,"(pendingRangeStart < 0x10000)","pendingRangeStart < 0x10000");
          if (!bVar4) goto LAB_00d2e019;
          *puVar6 = 0;
        }
        if (_ignore != 0xffffffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x7e8,"(pendingRangeEnd == INVALID_CODEPOINT)",
                             "pendingRangeEnd == INVALID_CODEPOINT");
          if (!bVar4) goto LAB_00d2e019;
          *puVar6 = 0;
        }
        if (cVar7 < codePointValue_00) {
          Fail(this,-0x7ff5ec63);
        }
        cVar7 = 0xffffffff;
        goto LAB_00d2de9c;
      }
    }
    else if (codePointValue_00 == 0xffffffff) {
LAB_00d2de9c:
      cVar2 = _ignore;
      codePointValue_00 = 0xffffffff;
    }
    else {
      if ((cVar7 & _ignore) == 0xffffffff) {
        cVar7 = 0xffffffff;
        local_34 = codePointValue_00;
      }
      else {
        if (this->next == this->positionAfterLastSurrogate) {
          codePointValue = this->valueOfLastSurrogate;
          if (rightSingleChar._1_1_ == '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x7f8,"(!previousSurrogatePart)","!previousSurrogatePart");
            if (!bVar4) goto LAB_00d2e019;
            *puVar6 = 0;
          }
          cVar7 = 0xffffffff;
        }
        else {
          EVar3 = ECLookahead(this,0);
          codePointValue = _ignore;
          if (_ignore == 0xffffffff) {
            codePointValue = cVar7;
          }
          if (EVar3 != ']') {
            codePointValue = _ignore;
          }
        }
        cVar2 = cVar7;
        if (codePointValue == 0xffffffff) goto LAB_00d2dfa7;
        if (codePointValue_00 < 0x10000) {
          local_40 = (char16)codePointValue_00;
        }
        else {
          Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue_00,&local_44,&local_40);
        }
        if (codePointValue < 0x10000) {
          local_3e = (char16)codePointValue;
        }
        else {
          Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue,&local_3e,&local_44);
        }
        if ((codePointValue < codePointValue_00) && ((codePointValue | codePointValue_00) < 0x10000)
           ) {
          Fail(this,-0x7ff5ec63);
        }
        else {
          if ((ushort)local_3e < (ushort)local_40) {
            DeferredFailIfNotUnicode(this,-0x7ff5ec63);
          }
          if (codePointValue < codePointValue_00) {
            DeferredFailIfUnicode(this,-0x7ff5ec63);
          }
        }
        local_34 = 0xffffffff;
      }
      cVar2 = 0xffffffff;
      codePointValue_00 = local_34;
    }
LAB_00d2dfa7:
    local_34 = codePointValue_00;
    _ignore = cVar2;
    EVar3 = ECLookahead(this,0);
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::CharacterClassPass0()
    {
        // Could be terminating 0
        if (ECLookahead() == '^')
            ECConsume();

        EncodedChar nextChar = ECLookahead();
        const EncodedChar* current;
        codepoint_t lastCodepoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        codepoint_t pendingRangeEnd = INVALID_CODEPOINT;
        bool previousSurrogatePart = false;

        while(nextChar != ']')
        {
            current = next;

            if (nextChar == '\0' && IsEOF())
            {
                // Report as unclosed '['
                Fail(JSERR_RegExpNoBracket);
                return;
            } // Otherwise embedded '\0' is ok
            else if (nextChar == '\\')
            {
                // Consume, as classescapepass0 expects for it to be consumed
                Char outChar = NextChar();
                // If previousSurrogatePart = true upon leaving this method, then we are going to pass through here twice
                // This is because \u{} escape sequence was encountered that is actually 2 characters, the second time we will pass consuming entire character
                if (ClassEscapePass0(outChar, previousSurrogatePart))
                {
                    lastCodepoint = outChar;
                }
                else
                {
                    // Last codepoint isn't a singleton, so no codepoint tracking for the sake of ranges is needed.
                    lastCodepoint = INVALID_CODEPOINT;
                    // Unless we have a possible range end, cancel our range tracking.
                    if (pendingRangeEnd == INVALID_CODEPOINT)
                    {
                        pendingRangeStart = INVALID_CODEPOINT;
                    }
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || lastCodepoint == INVALID_CODEPOINT)
                {
                    // '-' is the upper part of the range, with pendingRangeStart codepoint is the lower. Set  lastCodePoint to '-' to check at the end of the while statement
                    // OR
                    // '-' is just a char, consume it and set as last char
                    lastCodepoint = NextChar();
                }
                else
                {
                    pendingRangeStart = this->next == this->positionAfterLastSurrogate
                        ? this->valueOfLastSurrogate
                        : lastCodepoint;
                    lastCodepoint = INVALID_CODEPOINT;
                    NextChar();
                }

                // If we have a pattern of the form [\ud800-\udfff], we need this to be interpreted as a range.
                // In order to achieve this, the two variables that we use to track surrogate pairs, namely
                // tempLocationOfSurrogatePair and previousSurrogatePart, need to be in a certain state.
                //
                // We need to reset tempLocationOfSurrogatePair as it points to the first Unicode escape (\ud800)
                // when we're here. We need to clear it in order not to have a surrogate pair when we process the
                // second escape (\udfff).
                //
                // previousSurrogatePart is used when we have a code point in the \u{...} extended format and the
                // character is in a supplementary plane. However, there is no need to change its value here. When
                // such an escape sequence is encountered, the first call to ClassEscapePass0() sets the variable
                // to true, but it rewinds the input back to the beginning of the escape sequence. The next
                // iteration of the loop here will again call ClassEscape0() with the same character and the
                // variable will this time be set to false. Therefore, the variable will always be false here.
                tempLocationOfSurrogatePair = nullptr;
                Assert(!previousSurrogatePart);
            }
            else
            {
                lastCodepoint = NextChar();

                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(lastCodepoint, current, (uint32)(next - current));
                }
            }

            if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
            {
                // This is much easier to handle.
                if (pendingRangeStart != INVALID_CODEPOINT && lastCodepoint != INVALID_CODEPOINT)
                {
                    Assert(pendingRangeStart < 0x10000);
                    Assert(pendingRangeEnd == INVALID_CODEPOINT);
                    if (pendingRangeStart > lastCodepoint)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    pendingRangeStart = lastCodepoint = INVALID_CODEPOINT;
                }
            }
            // We have a candidate for range end, and we have a range start.
            else if (pendingRangeStart != INVALID_CODEPOINT && (lastCodepoint != INVALID_CODEPOINT || pendingRangeEnd != INVALID_CODEPOINT))
            {
                // The following will be true at the end of each surrogate pair parse.
                // Note, the escape sequence \u{} is a two time parse, so this will be true on the second time around.
                if (this->next == this->positionAfterLastSurrogate)
                {
                    lastCodepoint = this->valueOfLastSurrogate;
                    Assert(!previousSurrogatePart);
                    pendingRangeEnd = lastCodepoint;

                    lastCodepoint = INVALID_CODEPOINT;
                }
                // If the next character is the end of range ']', then we can't have a surrogate pair.
                // The current character is the range end, if we don't already have a candidate.
                else if (ECLookahead() == ']' && pendingRangeEnd == INVALID_CODEPOINT)
                {
                    pendingRangeEnd = lastCodepoint;
                }

                //If we get here, and pendingRangeEnd is set. Then one of the above has caused it to be set, or the previous iteration of the loop.
                if (pendingRangeEnd != INVALID_CODEPOINT)
                {
                    char16 leftSingleChar, rightSingleChar, ignore;

                    if (pendingRangeStart >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeStart, &ignore, &leftSingleChar);
                    }
                    else
                    {
                        leftSingleChar = (char16)pendingRangeStart;
                    }

                    if (pendingRangeEnd >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeEnd, &rightSingleChar, &ignore);
                    }
                    else
                    {
                        rightSingleChar = (char16)pendingRangeEnd;
                    }

                    // Here it is a bit tricky, we don't know if we have a unicode option specified.
                    // If it is, then \ud800\udc00 - \ud800\udc01 is valid, otherwise invalid.
                    if (pendingRangeStart < 0x10000 && pendingRangeEnd < 0x10000 && pendingRangeStart > pendingRangeEnd)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    else
                    {
                        if(leftSingleChar > rightSingleChar)
                        {
                            DeferredFailIfNotUnicode(JSERR_RegExpBadRange);
                        }

                        if (pendingRangeStart > pendingRangeEnd)
                        {
                            DeferredFailIfUnicode(JSERR_RegExpBadRange);
                        }
                    }

                    pendingRangeStart = pendingRangeEnd = INVALID_CODEPOINT;
                }
                // The current char < 0x10000 is a candidate for the range end, but we need to iterate one more time.
                else
                {
                    pendingRangeEnd = lastCodepoint;
                }
            }
            nextChar = ECLookahead();
        }

        // We should never have a pendingRangeEnd set when we exit the loop
        Assert(pendingRangeEnd == INVALID_CODEPOINT);
    }